

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

nghttp2_hd_nv *
nghttp2_hd_table_get(nghttp2_hd_nv *__return_storage_ptr__,nghttp2_hd_context *context,size_t idx)

{
  uint8_t uVar1;
  undefined3 uVar2;
  nghttp2_hd_entry *pnVar3;
  nghttp2_hd_static_entry *ent;
  size_t idx_local;
  nghttp2_hd_context *context_local;
  
  if (idx < (context->hd_table).len + 0x3d) {
    if (idx < 0x3d) {
      __return_storage_ptr__->name = &static_table[idx].name;
      __return_storage_ptr__->value = &static_table[idx].value;
      __return_storage_ptr__->token = static_table[idx].token;
      __return_storage_ptr__->flags = '\0';
    }
    else {
      pnVar3 = hd_ringbuf_get(&context->hd_table,idx - 0x3d);
      __return_storage_ptr__->name = (pnVar3->nv).name;
      __return_storage_ptr__->value = (pnVar3->nv).value;
      uVar1 = (pnVar3->nv).flags;
      uVar2 = *(undefined3 *)&(pnVar3->nv).field_0x15;
      __return_storage_ptr__->token = (pnVar3->nv).token;
      __return_storage_ptr__->flags = uVar1;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = uVar2;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("INDEX_RANGE_VALID(context, idx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                ,0x516,"nghttp2_hd_nv nghttp2_hd_table_get(nghttp2_hd_context *, size_t)");
}

Assistant:

nghttp2_hd_nv nghttp2_hd_table_get(nghttp2_hd_context *context, size_t idx) {
  assert(INDEX_RANGE_VALID(context, idx));
  if (idx >= NGHTTP2_STATIC_TABLE_LENGTH) {
    return hd_ringbuf_get(&context->hd_table, idx - NGHTTP2_STATIC_TABLE_LENGTH)
        ->nv;
  } else {
    const nghttp2_hd_static_entry *ent = &static_table[idx];
    nghttp2_hd_nv nv = {(nghttp2_rcbuf *)&ent->name,
                        (nghttp2_rcbuf *)&ent->value, ent->token,
                        NGHTTP2_NV_FLAG_NONE};
    return nv;
  }
}